

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::replace_illegal_names
          (CompilerGLSL *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords)

{
  ParsedIR *this_00;
  uint id_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  SPIRVariable *var;
  Meta *pMVar4;
  const_iterator cVar5;
  SPIRType *pSVar6;
  char *pcVar7;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  Decoration *memb;
  Decoration *__k;
  long lVar9;
  LoopLock local_70;
  CompilerGLSL *local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  TypedID<(spirv_cross::Types)0> *local_58;
  string local_50;
  
  this_00 = &(this->super_Compiler).ir;
  local_60 = &keywords->_M_h;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar8 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar1 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_68 = this;
  for (lVar9 = 0; sVar1 << 2 != lVar9; lVar9 = lVar9 + 4) {
    id_00 = *(uint *)((long)&pTVar8->id + lVar9);
    if ((local_68->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id_00].type ==
        TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id_00);
      bVar2 = Compiler::is_hidden_variable(&local_68->super_Compiler,var,false);
      if (!bVar2) {
        pMVar4 = ParsedIR::find_meta(this_00,(ID)(var->super_IVariant).self.id);
        if (pMVar4 != (Meta *)0x0) {
          pcVar7 = "gl_";
          iVar3 = ::std::__cxx11::string::compare((ulong)pMVar4,0,(char *)0x3);
          if (iVar3 != 0) {
            cVar5 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(local_60,(key_type *)pMVar4);
            if (cVar5.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) goto LAB_0020d4ee;
          }
          join<char_const(&)[2],std::__cxx11::string&>
                    (&local_50,(spirv_cross *)0x30ed65,(char (*) [2])pMVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
          ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
LAB_0020d4ee:
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar8 = (local_68->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_58 = pTVar8 + (local_68->super_Compiler).ir.ids_for_type[1].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  do {
    if (pTVar8 == local_58) {
      ParsedIR::LoopLock::~LoopLock(&local_70);
      return;
    }
    if ((local_68->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[pTVar8->id].
        type == TypeType) {
      pSVar6 = ParsedIR::get<spirv_cross::SPIRType>(this_00,pTVar8->id);
      pMVar4 = ParsedIR::find_meta(this_00,(ID)(pSVar6->super_IVariant).self.id);
      if (pMVar4 != (Meta *)0x0) {
        pcVar7 = "gl_";
        iVar3 = ::std::__cxx11::string::compare((ulong)pMVar4,0,(char *)0x3);
        if (iVar3 == 0) {
LAB_0020d5af:
          join<char_const(&)[2],std::__cxx11::string&>
                    (&local_50,(spirv_cross *)0x30ed65,(char (*) [2])pMVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
          ::std::__cxx11::string::operator=((string *)pMVar4,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          cVar5 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(local_60,(key_type *)pMVar4);
          if (cVar5.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) goto LAB_0020d5af;
        }
        __k = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        for (lVar9 = (pMVar4->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size *
                     0x160; lVar9 != 0; lVar9 = lVar9 + -0x160) {
          pcVar7 = "gl_";
          iVar3 = ::std::__cxx11::string::compare((ulong)__k,0,(char *)0x3);
          if (iVar3 == 0) {
LAB_0020d611:
            join<char_const(&)[2],std::__cxx11::string&>
                      (&local_50,(spirv_cross *)0x30ed65,(char (*) [2])__k,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
            ::std::__cxx11::string::operator=((string *)__k,(string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          else {
            cVar5 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(local_60,&__k->alias);
            if (cVar5.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_0020d611;
          }
          __k = __k + 1;
        }
      }
    }
    pTVar8 = pTVar8 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::replace_illegal_names(const unordered_set<string> &keywords)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (is_hidden_variable(var))
			return;

		auto *meta = ir.find_meta(var.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (m.alias.compare(0, 3, "gl_") == 0 || keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);
	});

	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		auto *meta = ir.find_meta(type.self);
		if (!meta)
			return;

		auto &m = meta->decoration;
		if (m.alias.compare(0, 3, "gl_") == 0 || keywords.find(m.alias) != end(keywords))
			m.alias = join("_", m.alias);

		for (auto &memb : meta->members)
			if (memb.alias.compare(0, 3, "gl_") == 0 || keywords.find(memb.alias) != end(keywords))
				memb.alias = join("_", memb.alias);
	});
}